

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkSweep(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                  ,0x263,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkToBdd(pNtk);
  if (iVar2 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    iVar2 = 1;
  }
  else {
    iVar2 = pNtk->nObjCounts[7];
    Abc_NtkCleanup(pNtk,0);
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    p = Vec_PtrAlloc(100);
    for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar7);
      if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
         ((pAVar5->vFanins).nSize < 2)) {
        Vec_PtrPush(p,pAVar5);
      }
    }
    while (0 < p->nSize) {
      uVar3 = p->nSize - 1;
      p->nSize = uVar3;
      pAVar5 = (Abc_Obj_t *)p->pArray[uVar3];
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7) {
        pAVar6 = Abc_NodeFindNonCoFanout(pAVar5);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          if ((*(uint *)&pAVar6->field_0x14 & 0xf) != 7) {
            __assert_fail("Abc_ObjIsNode(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                          ,0x280,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
          }
          iVar7 = (pAVar5->vFanins).nSize;
          if (iVar7 == 1) {
            pAVar1 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
            iVar7 = Abc_NodeIsInv(pAVar5);
            if (iVar7 != 0) {
              Abc_NodeComplementInput(pAVar6,pAVar5);
            }
            Abc_ObjPatchFanin(pAVar6,pAVar5,pAVar1);
          }
          else {
            if (iVar7 != 0) {
              __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                            ,0x286,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
            }
            iVar7 = Abc_NodeIsConst0(pAVar5);
            Abc_NodeConstantInput(pAVar6,pAVar5,iVar7);
          }
          Abc_NodeRemoveDupFanins(pAVar6);
          Abc_NodeMinimumBase(pAVar6);
          if ((pAVar6->vFanins).nSize < 2) {
            Vec_PtrPush(p,pAVar6);
          }
          if ((pAVar5->vFanouts).nSize < 1) {
            Abc_NtkDeleteObj_rec(pAVar5,1);
          }
          else {
            Vec_PtrPush(p,pAVar5);
          }
        }
      }
    }
    Vec_PtrFree(p);
    for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkCo(pNtk,iVar7);
      pAVar5 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
      if ((((pAVar5->vFanins).nSize == 1) &&
          (pAVar1 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray],
          (pAVar1->vFanouts).nSize == 1)) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
        iVar4 = Abc_NodeIsInv(pAVar5);
        if (iVar4 != 0) {
          *(byte *)&pAVar1->field_5 = *(byte *)&pAVar1->field_5 ^ 1;
        }
        Abc_ObjPatchFanin(pAVar6,pAVar5,pAVar1);
      }
    }
    Abc_NtkCleanup(pNtk,0);
    if (fVerbose != 0) {
      printf("Sweep removed %d nodes.\n",(ulong)(uint)(iVar2 - pNtk->nObjCounts[7]));
    }
    iVar2 = iVar2 - pNtk->nObjCounts[7];
  }
  return iVar2;
}

Assistant:

int Abc_NtkSweep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanout, * pDriver;
    int i, nNodesOld;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 1;
    }
    // perform cleanup
    nNodesOld = Abc_NtkNodeNum(pNtk);
    Abc_NtkCleanup( pNtk, 0 );
    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    // collect sweepable nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( Abc_ObjFaninNum(pNode) < 2 )
            Vec_PtrPush( vNodes, pNode );
    // sweep the nodes
    while ( Vec_PtrSize(vNodes) > 0 )
    {
        // get any sweepable node
        pNode = (Abc_Obj_t *)Vec_PtrPop(vNodes);
        if ( !Abc_ObjIsNode(pNode) )
            continue;
        // get any non-CO fanout of this node
        pFanout = Abc_NodeFindNonCoFanout(pNode);
        if ( pFanout == NULL )
            continue;
        assert( Abc_ObjIsNode(pFanout) );
        // transform the function of the fanout
        if ( Abc_ObjFaninNum(pNode) == 0 )
            Abc_NodeConstantInput( pFanout, pNode, Abc_NodeIsConst0(pNode) );
        else 
        {
            assert( Abc_ObjFaninNum(pNode) == 1 );
            pDriver = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsInv(pNode) )
                Abc_NodeComplementInput( pFanout, pNode );
            Abc_ObjPatchFanin( pFanout, pNode, pDriver );
        }
        Abc_NodeRemoveDupFanins( pFanout );
        Abc_NodeMinimumBase( pFanout );
        // check if the fanout should be added
        if ( Abc_ObjFaninNum(pFanout) < 2 )
            Vec_PtrPush( vNodes, pFanout );
        // check if the node has other fanouts
        if ( Abc_ObjFanoutNum(pNode) > 0 )
            Vec_PtrPush( vNodes, pNode );
        else
            Abc_NtkDeleteObj_rec( pNode, 1 );
    }
    Vec_PtrFree( vNodes );
    // sweep a node into its CO fanout if all of this is true:
    // (a) this node is a single-input node
    // (b) the driver of the node has only one fanout (this node)
    // (c) the driver is a node
    Abc_NtkForEachCo( pNtk, pFanout, i )
    {
        pNode = Abc_ObjFanin0(pFanout);
        if ( Abc_ObjFaninNum(pNode) != 1 )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( !(Abc_ObjFanoutNum(pDriver) == 1 && Abc_ObjIsNode(pDriver)) )
            continue;
        // trasform this CO
        if ( Abc_NodeIsInv(pNode) )
            pDriver->pData = Cudd_Not(pDriver->pData);
        Abc_ObjPatchFanin( pFanout, pNode, pDriver );
    }
    // perform cleanup
    Abc_NtkCleanup( pNtk, 0 );
    // report
    if ( fVerbose )
        printf( "Sweep removed %d nodes.\n", nNodesOld - Abc_NtkNodeNum(pNtk) );
    return nNodesOld - Abc_NtkNodeNum(pNtk);
}